

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

MAP_TYPE * duckdb::ModeStandard<unsigned_long>::CreateEmpty(ArenaAllocator *param_1)

{
  MAP_TYPE *pMVar1;
  
  pMVar1 = (MAP_TYPE *)operator_new(0x38);
  *(undefined8 *)&(pMVar1->_M_h)._M_rehash_policy = 0;
  (pMVar1->_M_h)._M_rehash_policy._M_next_resize = 0;
  (pMVar1->_M_h)._M_buckets = &(pMVar1->_M_h)._M_single_bucket;
  (pMVar1->_M_h)._M_bucket_count = 1;
  (pMVar1->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pMVar1->_M_h)._M_element_count = 0;
  (pMVar1->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (pMVar1->_M_h)._M_rehash_policy._M_next_resize = 0;
  (pMVar1->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  return pMVar1;
}

Assistant:

static MAP_TYPE *CreateEmpty(ArenaAllocator &) {
		return new MAP_TYPE();
	}